

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O0

cupdlp_dcs * cupdlp_dcs_spalloc(int m,int n,int nzmax,int values,int triplet)

{
  int *piVar1;
  int in_ECX;
  int iVar2;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  cupdlp_dcs *A;
  cupdlp_dcs *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int n_00;
  double *local_38;
  int local_2c;
  cupdlp_dcs *local_8;
  
  n_00 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_8 = (cupdlp_dcs *)cupdlp_dcs_calloc(n_00,(size_t)in_stack_ffffffffffffffb8);
  if (local_8 == (cupdlp_dcs *)0x0) {
    local_8 = (cupdlp_dcs *)0x0;
  }
  else {
    local_8->m = in_EDI;
    local_8->n = in_ESI;
    local_2c = in_EDX;
    if (in_EDX < 2) {
      local_2c = 1;
    }
    local_8->nzmax = local_2c;
    iVar2 = -1;
    if (in_R8D != 0) {
      iVar2 = 0;
    }
    local_8->nz = iVar2;
    piVar1 = (int *)cupdlp_dcs_malloc(n_00,(size_t)in_stack_ffffffffffffffb8);
    local_8->p = piVar1;
    piVar1 = (int *)cupdlp_dcs_malloc(n_00,(size_t)in_stack_ffffffffffffffb8);
    local_8->i = piVar1;
    if (in_ECX == 0) {
      local_38 = (double *)0x0;
    }
    else {
      local_38 = (double *)cupdlp_dcs_malloc(n_00,(size_t)in_stack_ffffffffffffffb8);
    }
    local_8->x = local_38;
    if (((local_8->p == (int *)0x0) || (local_8->i == (int *)0x0)) ||
       ((in_ECX != 0 && (local_8->x == (double *)0x0)))) {
      local_8 = cupdlp_dcs_spfree(in_stack_ffffffffffffffb8);
    }
  }
  return local_8;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_spalloc(int m, int n, int nzmax, int values,
                               int triplet) {
  cupdlp_dcs *A = cupdlp_dcs_calloc(
      1, sizeof(cupdlp_dcs)); /* allocate the cupdlp_dcs struct */
  if (!A) return (NULL);      /* out of memory */
  A->m = m;                   /* define dimensions and nzmax */
  A->n = n;
  A->nzmax = nzmax = MAX(nzmax, 1);
  A->nz = triplet ? 0 : -1; /* allocate triplet or comp.col */
  A->p = cupdlp_dcs_malloc(triplet ? nzmax : n + 1, sizeof(int));
  A->i = cupdlp_dcs_malloc(nzmax, sizeof(int));
  A->x = values ? cupdlp_dcs_malloc(nzmax, sizeof(double)) : NULL;
  return ((!A->p || !A->i || (values && !A->x)) ? cupdlp_dcs_spfree(A) : A);
}